

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::Resize
          (TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *this,int64_t newsize)

{
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *pfVar1;
  _Invoker_type p_Var2;
  _Any_data *p_Var3;
  ostream *poVar4;
  int64_t *piVar5;
  _Any_data *p_Var6;
  long lVar7;
  long lVar8;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *pfVar9;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar4 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar8 = this->fNElements;
  if (lVar8 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pfVar9 = this->fStore;
      if (pfVar9 != (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x0) {
        p_Var2 = pfVar9[-1]._M_invoker;
        if (p_Var2 != (_Invoker_type)0x0) {
          lVar8 = (long)p_Var2 * -0x20;
          p_Var3 = (_Any_data *)(pfVar9 + (long)p_Var2);
          do {
            p_Var6 = p_Var3 + -2;
            if (*(_Manager_type *)(p_Var3 + -1) != (_Manager_type)0x0) {
              (**(_Manager_type *)(p_Var3 + -1))(p_Var6,p_Var6,__destroy_functor);
            }
            lVar8 = lVar8 + 0x20;
            p_Var3 = p_Var6;
          } while (lVar8 != 0);
        }
        operator_delete__(&pfVar9[-1]._M_invoker,(long)p_Var2 << 5 | 8);
      }
      this->fStore = (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x0;
    }
    else {
      piVar5 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3b != 0) | newsize << 5 | 8);
      *piVar5 = newsize;
      pfVar9 = (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)(piVar5 + 1);
      memset(pfVar9,0,newsize << 5);
      if (newsize <= lVar8) {
        lVar8 = newsize;
      }
      if (0 < lVar8) {
        lVar7 = 0;
        do {
          std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::operator=
                    ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
                     ((long)&(pfVar9->super__Function_base)._M_functor + lVar7),
                     (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
                     ((long)&(this->fStore->super__Function_base)._M_functor + lVar7));
          lVar7 = lVar7 + 0x20;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      pfVar1 = this->fStore;
      if (pfVar1 != (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x0) {
        p_Var2 = pfVar1[-1]._M_invoker;
        if (p_Var2 != (_Invoker_type)0x0) {
          lVar8 = (long)p_Var2 * -0x20;
          p_Var3 = (_Any_data *)(pfVar1 + (long)p_Var2);
          do {
            p_Var6 = p_Var3 + -2;
            if (*(code **)(p_Var3 + -1) != (code *)0x0) {
              (**(code **)(p_Var3 + -1))(p_Var6,p_Var6,__destroy_functor);
            }
            lVar8 = lVar8 + 0x20;
            p_Var3 = p_Var6;
          } while (lVar8 != 0);
        }
        operator_delete__(&pfVar1[-1]._M_invoker,(long)p_Var2 << 5 | 8);
      }
      this->fStore = pfVar9;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}